

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenUnionUnPack_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,string *camel_name,
          string *camel_name_short,bool is_vector)

{
  __type _Var1;
  bool bVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  string local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  EnumVal *local_388;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_378;
  const_iterator eit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  undefined1 local_108 [8];
  string indent;
  undefined1 local_e0 [8];
  string func_suffix;
  undefined1 local_b8 [8];
  string type_suffix;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string class_member;
  string varialbe_name;
  string *code;
  bool is_vector_local;
  string *camel_name_short_local;
  string *camel_name_local;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  CSharpGenerator *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&class_member.field_2 + 8),"_o.",camel_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"Value",&local_81);
  std::allocator<char>::~allocator(&local_81);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)enum_def);
  if (_Var1) {
    std::__cxx11::string::operator+=((string *)local_80,"_");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"",(allocator<char> *)(func_suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(func_suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"()",(allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"    ",&local_109);
  std::allocator<char>::~allocator(&local_109);
  if (is_vector) {
    std::operator+(&local_130,"_o_",camel_name);
    std::__cxx11::string::operator=
              ((string *)(class_member.field_2._M_local_buf + 8),(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::operator=((string *)local_b8,"(_j)");
    std::__cxx11::string::operator=((string *)local_e0,"(_j)");
    std::__cxx11::string::operator=((string *)local_108,"      ");
    std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "var ");
    std::operator+(&local_170,&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_150,&local_170," = new ");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
  }
  else {
    std::operator+(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_1b0,&local_1d0," = new ");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  NamespacedName_abi_cxx11_(&local_210,this,&enum_def->super_Definition);
  std::operator+(&local_1f0,&local_210,"Union();\n");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::operator+(&local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&class_member.field_2 + 8));
  std::operator+(&local_2b0,&local_2d0,".Type = this.");
  std::operator+(&local_290,&local_2b0,camel_name_short);
  std::operator+(&local_270,&local_290,"Type");
  std::operator+(&local_250,&local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::operator+(&local_230,&local_250,";\n");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "switch (this.");
  std::operator+(&local_350,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                 camel_name_short);
  std::operator+(&local_330,&local_350,"Type");
  std::operator+(&local_310,&local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::operator+(&local_2f0,&local_310,") {\n");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&eit);
  pvVar3 = EnumDef::Vals(enum_def);
  local_378._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3);
  while( true ) {
    pvVar3 = EnumDef::Vals(enum_def);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3);
    bVar2 = __gnu_cxx::operator!=
                      (&local_378,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar2) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_378);
    local_388 = *ppEVar4;
    if ((local_388->union_type).base_type == BASE_TYPE_NONE) {
      std::operator+(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "  default: break;\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    else {
      std::operator+(&local_448,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "  case ");
      NamespacedName_abi_cxx11_(&local_468,this,&enum_def->super_Definition);
      std::operator+(&local_428,&local_448,&local_468);
      std::operator+(&local_408,&local_428,".");
      std::operator+(&local_3e8,&local_408,&local_388->name);
      std::operator+(&local_3c8,&local_3e8,":\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_448);
      std::operator+(&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "    ");
      std::operator+(&local_508,&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_4e8,&local_508,".");
      std::operator+(&local_4c8,&local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_4a8,&local_4c8," = this.");
      std::operator+(&local_488,&local_4a8,camel_name);
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      bVar2 = IsString(&local_388->union_type);
      if (bVar2) {
        std::operator+(&local_568,"AsString",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+(&local_548,&local_568,";\n");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_548);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
      }
      else {
        GenTypeGet_abi_cxx11_(&local_5e8,this,&local_388->union_type);
        std::operator+(&local_5c8,"<",&local_5e8);
        std::operator+(&local_5a8,&local_5c8,">");
        std::operator+(&local_588,&local_5a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::operator+(&local_608,".HasValue ? this.",camel_name);
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_608);
        std::__cxx11::string::~string((string *)&local_608);
        GenTypeGet_abi_cxx11_(&local_6a8,this,&local_388->union_type);
        std::operator+(&local_688,"<",&local_6a8);
        std::operator+(&local_668,&local_688,">");
        std::operator+(&local_648,&local_668,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+(&local_628,&local_648,".Value.UnPack() : null;\n");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_628);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
      }
      std::operator+(&local_6c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "    break;\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_6c8);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_378);
  }
  std::operator+(&local_6e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "}\n");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  if (is_vector) {
    std::operator+(&local_788,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_o.");
    std::operator+(&local_768,&local_788,camel_name);
    std::operator+(&local_748,&local_768,".Add(");
    std::operator+(&local_728,&local_748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_708,&local_728,");\n");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_788);
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(class_member.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string *code_ptr,
                                const std::string &camel_name,
                                const std::string &camel_name_short,
                                bool is_vector) const {
    auto &code = *code_ptr;
    std::string varialbe_name = "_o." + camel_name;
    std::string class_member = "Value";
    if (class_member == enum_def.name) class_member += "_";
    std::string type_suffix = "";
    std::string func_suffix = "()";
    std::string indent = "    ";
    if (is_vector) {
      varialbe_name = "_o_" + camel_name;
      type_suffix = "(_j)";
      func_suffix = "(_j)";
      indent = "      ";
    }
    if (is_vector) {
      code += indent + "var " + varialbe_name + " = new ";
    } else {
      code += indent + varialbe_name + " = new ";
    }
    code += NamespacedName(enum_def) + "Union();\n";
    code += indent + varialbe_name + ".Type = this." + camel_name_short +
            "Type" + type_suffix + ";\n";
    code += indent + "switch (this." + camel_name_short + "Type" + type_suffix +
            ") {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += indent + "  default: break;\n";
      } else {
        code += indent + "  case " + NamespacedName(enum_def) + "." + ev.name +
                ":\n";
        code += indent + "    " + varialbe_name + "." + class_member +
                " = this." + camel_name;
        if (IsString(ev.union_type)) {
          code += "AsString" + func_suffix + ";\n";
        } else {
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix;
          code += ".HasValue ? this." + camel_name;
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix +
                  ".Value.UnPack() : null;\n";
        }
        code += indent + "    break;\n";
      }
    }
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_o." + camel_name + ".Add(" + varialbe_name + ");\n";
    }
  }